

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::PrintTupleTo<std::tuple<int,bool>,2ul>(byte *t,ostream *param_2)

{
  char *pcVar1;
  
  std::ostream::operator<<(param_2,*(int *)(t + 4));
  std::__ostream_insert<char,std::char_traits<char>>(param_2,", ",2);
  pcVar1 = "optional_bool: false";
  if ((ulong)*t != 0) {
    pcVar1 = "Saw json_name: true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(param_2,pcVar1 + 0xf,(ulong)*t ^ 5);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}